

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O1

void __thiscall CMU462::DynamicScene::Skeleton::setZAxis(Skeleton *this,Vector3D *axis)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined4 in_XMM4_Db;
  double dVar4;
  double dVar5;
  
  dVar1 = axis->z * axis->z + axis->x * axis->x + axis->y * axis->y;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  dVar1 = 1.0 / dVar1;
  dVar2 = axis->x * dVar1;
  axis->x = dVar2;
  dVar3 = axis->y * dVar1;
  axis->y = dVar3;
  dVar1 = dVar1 * axis->z;
  axis->z = dVar1;
  dVar1 = acos(dVar2 * 0.0 + dVar3 * 0.0 + dVar1);
  if (1e-05 < ABS((float)dVar1)) {
    dVar4 = axis->z * 0.0;
    dVar5 = axis->y - dVar4;
    dVar4 = dVar4 - axis->x;
    dVar3 = axis->x * 0.0 + axis->y * -0.0;
    dVar2 = dVar3 * dVar3 + dVar5 * dVar5 + dVar4 * dVar4;
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
      in_XMM4_Db = 0;
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    dVar2 = 1.0 / dVar2;
    glRotatef(CONCAT44(in_XMM4_Db,((float)dVar1 * -180.0) / 3.1415927),(float)(dVar5 * dVar2),
              (float)(dVar4 * dVar2),
              CONCAT44((int)((ulong)(dVar3 * dVar2) >> 0x20),(float)(dVar3 * dVar2)));
    return;
  }
  return;
}

Assistant:

void Skeleton::setZAxis(Vector3D axis)
  {
    Vector3D zAxis(0., 0., 1.);
    axis.normalize();
    float rot_angle = acos(dot(axis, zAxis));
    if (fabs(rot_angle) > 10E-6)
    {
      rot_angle = -rot_angle * 180 / M_PI;
      Vector3D rot_axis = cross(axis, zAxis);
      rot_axis.normalize();
      glRotatef(rot_angle, rot_axis.x, rot_axis.y, rot_axis.z);
    }
  }